

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadrb.c
# Opt level: O3

void sreadrb(int *nrow,int *ncol,int_t *nonz,float **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  int *addr;
  FILE *__stream;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  int_t *piVar8;
  int_t *addr_00;
  int_t *addr_01;
  void *addr_02;
  ulong uVar9;
  int_t *piVar10;
  float *pfVar11;
  ulong uVar12;
  uint uVar13;
  int_t *addr_03;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  float *addr_04;
  int iVar17;
  byte *__nptr;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  double dVar22;
  int tmp;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf_1 [100];
  char buf [100];
  int local_248;
  int local_21c;
  float **local_218;
  int_t **local_210;
  int_t **local_208;
  int_t *local_200;
  float *local_1f8;
  float *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  undefined1 local_1d4;
  byte local_1d3;
  undefined1 local_1d1;
  int_t *local_1d0;
  ulong local_1c8;
  long local_1c0;
  float *local_1b8;
  int_t *local_1b0;
  float *local_1a8;
  int_t *local_1a0;
  byte local_198 [256];
  byte local_98 [14];
  undefined1 local_8a;
  
  __stream = _stdin;
  local_218 = nzval;
  local_210 = rowind;
  local_208 = colptr;
  fgets((char *)local_98,100,_stdin);
  fputs((char *)local_98,_stdout);
  iVar21 = 4;
  iVar17 = 0;
  do {
    __isoc99_fscanf(__stream,"%14c",local_98);
    local_8a = 0;
    __isoc99_sscanf(local_98,"%d",&local_21c);
    if (iVar21 == 1) {
      iVar17 = local_21c;
    }
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  do {
    iVar21 = fgetc(__stream);
  } while (iVar21 != 10);
  __isoc99_fscanf(__stream,"%3c",&local_1d4);
  pbVar7 = local_98;
  __isoc99_fscanf(__stream,"%11c",pbVar7);
  local_1d1 = 0;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar21 = atoi((char *)pbVar7);
  *nrow = iVar21;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar21 = atoi((char *)pbVar7);
  *ncol = iVar21;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar21 = atoi((char *)pbVar7);
  *nonz = iVar21;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  local_21c = atoi((char *)pbVar7);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar21 = fgetc(__stream);
  } while (iVar21 != 10);
  sallocateA(*ncol,*nonz,local_218,local_210,local_208);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  sParseIntFormat((char *)pbVar7,&local_1d8,&local_1dc);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  sParseIntFormat((char *)pbVar7,&local_1e0,&local_1e4);
  __isoc99_fscanf(__stream,"%20c",pbVar7);
  do {
    bVar3 = *pbVar7;
    pbVar7 = pbVar7 + 1;
  } while (bVar3 != 0x28);
  local_248 = atoi((char *)pbVar7);
  while( true ) {
    do {
      __nptr = pbVar7 + 1;
      uVar5 = *pbVar7 - 0x44;
      pbVar7 = __nptr;
    } while (0x2c < uVar5);
    if ((0x700000007U >> ((ulong)uVar5 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      local_248 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar7 != 0x29 && (*pbVar7 != 0x2e)); pbVar7 = pbVar7 + 1) {
  }
  *pbVar7 = 0;
  uVar5 = atoi((char *)__nptr);
  do {
    iVar21 = fgetc(__stream);
  } while (iVar21 != 10);
  ReadVector((FILE *)__stream,*ncol + 1,*local_208,local_1d8,local_1dc);
  ReadVector((FILE *)__stream,*nonz,*local_210,local_1e0,local_1e4);
  if (iVar17 != 0) {
    iVar17 = *nonz;
    if (0 < (long)iVar17) {
      local_1f0 = *local_218;
      local_1f8 = (float *)(long)local_248;
      lVar18 = 0;
      do {
        fgets((char *)local_198,100,__stream);
        if (0 < local_248) {
          lVar18 = (long)(int)lVar18;
          uVar13 = 0;
          lVar20 = 0;
          do {
            lVar1 = lVar20 + 1;
            lVar16 = lVar1 * (int)uVar5;
            bVar3 = local_198[lVar16];
            local_198[lVar16] = 0;
            if (0 < (int)uVar5) {
              uVar12 = 0;
              do {
                if ((local_198[uVar12 + uVar13] | 0x20) == 100) {
                  local_198[uVar12 + uVar13] = 0x45;
                }
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
            }
            dVar22 = atof((char *)(local_198 + lVar20 * (int)uVar5));
            local_1f0[lVar18] = (float)dVar22;
            lVar18 = lVar18 + 1;
            local_198[lVar16] = bVar3;
          } while ((lVar1 < (long)local_1f8) &&
                  (uVar13 = uVar13 + uVar5, lVar20 = lVar1, lVar18 < iVar17));
        }
      } while ((int)lVar18 < iVar17);
    }
  }
  if ((local_1d3 & 0xdf) == 0x53) {
    uVar5 = *ncol;
    addr_03 = *local_210;
    addr = *local_208;
    addr_04 = *local_218;
    iVar17 = uVar5 + 1;
    piVar8 = intMalloc(iVar17);
    if (piVar8 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",
              0xc9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    local_1c8 = (ulong)uVar5;
    addr_00 = intMalloc(iVar17);
    local_200 = addr_00;
    if (addr_00 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      addr_00 = local_200;
      superlu_abort_and_exit((char *)local_198);
    }
    addr_01 = intMalloc(*nonz);
    if (addr_01 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",
              0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      addr_00 = local_200;
      superlu_abort_and_exit((char *)local_198);
    }
    addr_02 = superlu_malloc((long)*nonz << 2);
    local_1d0 = piVar8;
    if (addr_02 == (void *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf
              ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c")
      ;
      piVar8 = local_1d0;
      superlu_abort_and_exit((char *)local_198);
    }
    uVar12 = local_1c8;
    iVar21 = (int)local_1c8;
    if (iVar21 < 1) {
      *addr_00 = 0;
    }
    else {
      uVar19 = 0;
      memset(piVar8,0,local_1c8 * 4);
      iVar6 = *addr;
      do {
        lVar18 = uVar19 + 1;
        uVar19 = uVar19 + 1;
        iVar4 = addr[lVar18];
        if (iVar6 < addr[lVar18]) {
          lVar18 = (long)iVar6;
          do {
            piVar8[addr_03[lVar18]] = piVar8[addr_03[lVar18]] + 1;
            lVar18 = lVar18 + 1;
            iVar4 = addr[uVar19];
          } while (lVar18 < addr[uVar19]);
        }
        iVar6 = iVar4;
      } while (uVar19 != uVar12);
      *local_200 = 0;
      uVar19 = 0;
      do {
        local_200[uVar19 + 1] = piVar8[uVar19] + local_200[uVar19];
        piVar8[uVar19] = local_200[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar12 != uVar19);
      iVar6 = *addr;
      uVar19 = 0;
      do {
        uVar9 = uVar19 + 1;
        iVar4 = addr[uVar19 + 1];
        if (iVar6 < addr[uVar19 + 1]) {
          lVar18 = (long)iVar6;
          do {
            iVar6 = addr_03[lVar18];
            addr_01[piVar8[iVar6]] = (int_t)uVar19;
            iVar4 = piVar8[iVar6];
            *(float *)((long)addr_02 + (long)iVar4 * 4) = addr_04[lVar18];
            piVar8[iVar6] = iVar4 + 1;
            lVar18 = lVar18 + 1;
            iVar4 = addr[uVar9];
          } while (lVar18 < addr[uVar9]);
        }
        iVar6 = iVar4;
        uVar19 = uVar9;
        addr_00 = local_200;
      } while (uVar9 != uVar12);
    }
    lVar18 = (long)*nonz * 2 - (long)iVar21;
    piVar8 = intMalloc(iVar17);
    if (piVar8 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    piVar10 = intMalloc((int_t)lVar18);
    if (piVar10 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",
              0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    local_1c0 = lVar18;
    pfVar11 = (float *)superlu_malloc(lVar18 * 4);
    if (pfVar11 == (float *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec
              ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c")
      ;
      superlu_abort_and_exit((char *)local_198);
    }
    *piVar8 = 0;
    if (0 < iVar21) {
      pfVar15 = (float *)0x0;
      uVar19 = 0;
      local_1b8 = addr_04;
      local_1b0 = addr_03;
      local_1a0 = addr_01;
      do {
        lVar18 = (long)addr_00[uVar19];
        uVar9 = uVar19 + 1;
        iVar17 = addr_00[uVar19 + 1];
        if (addr_00[uVar19] < iVar17) {
          do {
            if (uVar19 != (uint)local_1a0[lVar18]) {
              iVar17 = (int)pfVar15;
              piVar10[iVar17] = local_1a0[lVar18];
              pfVar11[iVar17] = *(float *)((long)addr_02 + lVar18 * 4);
              pfVar15 = (float *)(ulong)(iVar17 + 1);
              iVar17 = addr_00[uVar9];
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < iVar17);
        }
        lVar18 = (long)addr[uVar19];
        if (addr[uVar19] < addr[uVar9]) {
          pfVar14 = pfVar11 + (int)pfVar15;
          lVar20 = 0;
          local_1f8 = pfVar14;
          local_1f0 = pfVar15;
          local_1a8 = pfVar15;
          do {
            piVar10[(int)pfVar15 + lVar20] = addr_03[lVar18 + lVar20];
            fVar2 = addr_04[lVar18 + lVar20];
            pfVar14[lVar20] = fVar2;
            if (ABS(fVar2) <= 0.0 && ABS(fVar2) != 0.0) {
              printf("%5d: %e\n",(ulong)(uint)((int)local_1f0 + (int)lVar20));
              pfVar14 = local_1f8;
            }
            lVar1 = lVar18 + lVar20;
            lVar20 = lVar20 + 1;
          } while (lVar1 + 1 < (long)addr[uVar9]);
          pfVar15 = (float *)(ulong)(uint)((int)local_1a8 + (int)lVar20);
          uVar12 = local_1c8;
          addr_03 = local_1b0;
          addr_04 = local_1b8;
          addr_00 = local_200;
        }
        piVar8[uVar9] = (int_t)pfVar15;
        uVar19 = uVar9;
        addr_01 = local_1a0;
      } while (uVar9 != uVar12);
    }
    lVar18 = local_1c0;
    printf("FormFullA: new_nnz = %lld\n",local_1c0);
    superlu_free(addr_04);
    superlu_free(addr_03);
    superlu_free(addr);
    superlu_free(local_1d0);
    superlu_free(addr_02);
    superlu_free(addr_01);
    superlu_free(addr_00);
    *local_218 = pfVar11;
    *local_210 = piVar10;
    *local_208 = piVar8;
    *nonz = (int_t)lVar18;
  }
  fclose(__stream);
  return;
}

Assistant:

void
sreadrb(int *nrow, int *ncol, int_t *nonz,
        float **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    sDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    sDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    sallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    sParseFloatFormat(buf, &valnum, &valsize);
    sDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        sReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}